

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

void __thiscall
icu_63::CanonIterData::addToStartSet
          (CanonIterData *this,UChar32 origin,UChar32 decompLead,UErrorCode *errorCode)

{
  uint32_t uVar1;
  UnicodeSet *this_00;
  size_t size;
  
  size = (size_t)(uint)decompLead;
  uVar1 = umutablecptrie_get_63(this->mutableTrie,decompLead);
  if (origin != 0 && (uVar1 & 0x3fffff) == 0) {
    umutablecptrie_set_63(this->mutableTrie,decompLead,uVar1 | origin,errorCode);
    return;
  }
  if ((uVar1 >> 0x15 & 1) == 0) {
    this_00 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,size);
    if (this_00 == (UnicodeSet *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    UnicodeSet::UnicodeSet(this_00);
    umutablecptrie_set_63
              (this->mutableTrie,decompLead,
               uVar1 & 0xffc00000 | (this->canonStartSets).count | 0x200000,errorCode);
    UVector::addElement(&this->canonStartSets,this_00,errorCode);
    if ((uVar1 & 0x1fffff) != 0) {
      UnicodeSet::add(this_00,uVar1 & 0x1fffff);
    }
  }
  else {
    this_00 = (UnicodeSet *)UVector::elementAt(&this->canonStartSets,uVar1 & 0x1fffff);
  }
  UnicodeSet::add(this_00,origin);
  return;
}

Assistant:

void CanonIterData::addToStartSet(UChar32 origin, UChar32 decompLead, UErrorCode &errorCode) {
    uint32_t canonValue = umutablecptrie_get(mutableTrie, decompLead);
    if((canonValue&(CANON_HAS_SET|CANON_VALUE_MASK))==0 && origin!=0) {
        // origin is the first character whose decomposition starts with
        // the character for which we are setting the value.
        umutablecptrie_set(mutableTrie, decompLead, canonValue|origin, &errorCode);
    } else {
        // origin is not the first character, or it is U+0000.
        UnicodeSet *set;
        if((canonValue&CANON_HAS_SET)==0) {
            set=new UnicodeSet;
            if(set==NULL) {
                errorCode=U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            UChar32 firstOrigin=(UChar32)(canonValue&CANON_VALUE_MASK);
            canonValue=(canonValue&~CANON_VALUE_MASK)|CANON_HAS_SET|(uint32_t)canonStartSets.size();
            umutablecptrie_set(mutableTrie, decompLead, canonValue, &errorCode);
            canonStartSets.addElement(set, errorCode);
            if(firstOrigin!=0) {
                set->add(firstOrigin);
            }
        } else {
            set=(UnicodeSet *)canonStartSets[(int32_t)(canonValue&CANON_VALUE_MASK)];
        }
        set->add(origin);
    }
}